

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archivable_dictionary.cpp
# Opt level: O0

bool __thiscall
ON_ArchivableDictionaryPrivate::TrySetValue<ON_UUID_struct>
          (ON_ArchivableDictionaryPrivate *this,wchar_t *key,ON_UUID_struct *value)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  pointer ppVar4;
  pointer pDVar5;
  DictionaryEntryT<ON_UUID_struct,_(DictionaryEntryType)11> *this_00;
  reference pOVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>,_bool>
  pVar7;
  ON_UUID_struct local_80;
  unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_> *entry_ptr;
  undefined1 local_68;
  void *local_50;
  pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>
  local_48;
  _Rb_tree_iterator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>
  local_38;
  pair<std::_Rb_tree_iterator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>,_bool>
  r;
  ON_UUID_struct *value_local;
  wchar_t *key_local;
  ON_ArchivableDictionaryPrivate *this_local;
  
  local_50 = (void *)0x0;
  r._8_8_ = value;
  value_local = (ON_UUID_struct *)key;
  key_local = (wchar_t *)this;
  std::
  pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>::
  pair<const_wchar_t_*&,_std::nullptr_t,_true>(&local_48,(wchar_t **)&value_local,&local_50);
  pVar7 = std::
          map<ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>,_std::less<void>,_std::allocator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>_>
          ::insert(&this->m_map,&local_48);
  entry_ptr = (unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_> *)
              pVar7.first._M_node;
  local_68 = pVar7.second;
  local_38._M_node = (_Base_ptr)entry_ptr;
  r.first._M_node._0_1_ = local_68;
  std::
  pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>::
  ~pair(&local_48);
  ppVar4 = std::
           _Rb_tree_iterator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>
           ::operator->(&local_38);
  local_80.Data4 = (uchar  [8])&ppVar4->second;
  if (((byte)r.first._M_node & 1) == 0) {
    pDVar5 = std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>::operator->
                       ((unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_> *)
                        local_80.Data4);
    iVar3 = (*pDVar5->_vptr_DictionaryEntry[2])();
    uVar2 = r._8_8_;
    if (iVar3 == 0xb) {
      this_00 = (DictionaryEntryT<ON_UUID_struct,_(DictionaryEntryType)11> *)
                std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>::get
                          ((unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_> *)
                           local_80.Data4);
      pOVar6 = DictionaryEntryT<ON_UUID_struct,_(DictionaryEntryType)11>::Value(this_00);
      uVar1 = *(undefined8 *)uVar2;
      pOVar6->Data1 = (int)uVar1;
      pOVar6->Data2 = (short)((ulong)uVar1 >> 0x20);
      pOVar6->Data3 = (short)((ulong)uVar1 >> 0x30);
      *(undefined8 *)pOVar6->Data4 = *(undefined8 *)(uVar2 + 8);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    make_entry<ON_UUID_struct>(&local_80);
    std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>::operator=
              ((unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>> *)local_80.Data4,
               (unique_ptr<Entry<ON_UUID_struct>,_std::default_delete<Entry<ON_UUID_struct>_>_> *)
               &local_80);
    std::unique_ptr<Entry<ON_UUID_struct>,_std::default_delete<Entry<ON_UUID_struct>_>_>::
    ~unique_ptr((unique_ptr<Entry<ON_UUID_struct>,_std::default_delete<Entry<ON_UUID_struct>_>_> *)
                &local_80);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool TrySetValue(const wchar_t* key, const V& value)
  {
    auto r = m_map.insert({ key, nullptr });
    auto& entry_ptr = r.first->second;

    if (r.second)
    {
      entry_ptr = make_entry(value);
      return true;
    }
    else if (entry_ptr->EntryType() == Entry<V>::Type)
    {
      static_cast<Entry<V>*>(entry_ptr.get())->Value() = value;
      return true;
    }

    return false;
  }